

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O3

void __thiscall
ImportSource_hasImportSourceDifferentImportSources_Test::TestBody
          (ImportSource_hasImportSourceDifferentImportSources_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ImporterPtr importer;
  ImportSourcePtr importSource1;
  ImportSourcePtr importSource2;
  long *local_80;
  AssertHelper local_78 [8];
  byte local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult local_60;
  long local_50 [2];
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Importer::create(SUB81(&local_40,0));
  libcellml::ImportSource::create();
  local_60._0_8_ = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"some_url","");
  libcellml::ImportSource::setUrl(local_30);
  if ((long *)local_60._0_8_ != local_50) {
    operator_delete((void *)local_60._0_8_,local_50[0] + 1);
  }
  libcellml::ImportSource::create();
  local_60._0_8_ = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"some_other_url","");
  libcellml::ImportSource::setUrl(local_20);
  if ((long *)local_60._0_8_ != local_50) {
    operator_delete((void *)local_60._0_8_,local_50[0] + 1);
  }
  bVar1 = libcellml::Importer::hasImportSource(local_40);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)local_70,"importer->hasImportSource(importSource1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x5e,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if ((long *)local_60._0_8_ != local_50) {
      operator_delete((void *)local_60._0_8_,local_50[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = libcellml::Importer::hasImportSource(local_40);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)local_70,"importer->hasImportSource(importSource2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x5f,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if ((long *)local_60._0_8_ != local_50) {
      operator_delete((void *)local_60._0_8_,local_50[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::addImportSource(local_40);
  local_70[0] = libcellml::Importer::hasImportSource(local_40);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70[0] == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)local_70,"importer->hasImportSource(importSource1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,99,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if ((long *)local_60._0_8_ != local_50) {
      operator_delete((void *)local_60._0_8_,local_50[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = libcellml::Importer::hasImportSource(local_40);
  local_70[0] = bVar1 ^ 1;
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)local_70,"importer->hasImportSource(importSource2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,100,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(local_78);
    if ((long *)local_60._0_8_ != local_50) {
      operator_delete((void *)local_60._0_8_,local_50[0] + 1);
    }
    if (local_80 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(ImportSource, hasImportSourceDifferentImportSources)
{
    auto importer = libcellml::Importer::create();

    auto importSource1 = libcellml::ImportSource::create();
    importSource1->setUrl("some_url");
    auto importSource2 = libcellml::ImportSource::create();
    importSource2->setUrl("some_other_url");

    EXPECT_FALSE(importer->hasImportSource(importSource1));
    EXPECT_FALSE(importer->hasImportSource(importSource2));

    importer->addImportSource(importSource1);

    EXPECT_TRUE(importer->hasImportSource(importSource1));
    EXPECT_FALSE(importer->hasImportSource(importSource2));
}